

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

ExpEmit __thiscall FxSwitchStatement::Emit(FxSwitchStatement *this,VMFunctionBuilder *build)

{
  FxExpression *this_00;
  FxJumpStatement **ppFVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  ExpEmit EVar6;
  FxExpression **ppFVar7;
  VM_SHALF opbc;
  int opcode;
  long lVar8;
  bool bVar9;
  CaseAddr *ca;
  CaseAddr *pCVar10;
  FxExpression **ppFVar11;
  CaseAddr *pCVar12;
  
  if (this->Condition == (FxExpression *)0x0) {
    __assert_fail("Condition != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x222f,"virtual ExpEmit FxSwitchStatement::Emit(VMFunctionBuilder *)");
  }
  uVar2 = (*this->Condition->_vptr_FxExpression[9])();
  if ((uVar2 & 0xff0000) != 0) {
    __assert_fail("emit.RegType == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x2231,"virtual ExpEmit FxSwitchStatement::Emit(VMFunctionBuilder *)");
  }
  uVar5 = (ulong)(this->CaseAddresses).Count;
  if (uVar5 != 0) {
    pCVar10 = (this->CaseAddresses).Array;
    pCVar12 = pCVar10 + uVar5;
    do {
      uVar3 = pCVar10->casevalue;
      opbc = (VM_SHALF)uVar3;
      if (uVar3 < 0x10000) {
        opcode = 0x42;
LAB_00536cf6:
        VMFunctionBuilder::Emit(build,opcode,uVar2 & 0xffff,opbc);
      }
      else {
        if (0xffff0000 < uVar3) {
          opbc = -opbc;
          opcode = 0x43;
          goto LAB_00536cf6;
        }
        uVar3 = VMFunctionBuilder::GetConstantInt(build,uVar3);
        VMFunctionBuilder::Emit(build,0x8a,1,uVar2 & 0xffff,uVar3);
      }
      sVar4 = VMFunctionBuilder::Emit(build,0x44,0);
      pCVar10->jumpaddress = sVar4;
      pCVar10 = pCVar10 + 1;
    } while (pCVar10 != pCVar12);
  }
  bVar9 = false;
  sVar4 = VMFunctionBuilder::Emit(build,0x44,0);
  uVar5 = (ulong)(this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Count;
  if (uVar5 != 0) {
    ppFVar11 = (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Array;
    ppFVar7 = ppFVar11 + uVar5;
    bVar9 = false;
    do {
      this_00 = *ppFVar11;
      if (this_00->ExprType == EFX_CaseStatement) {
        if (this_00[1]._vptr_FxExpression == (_func_int **)0x0) {
          VMFunctionBuilder::BackpatchToHere(build,sVar4);
          bVar9 = true;
        }
        else {
          uVar5 = (ulong)(this->CaseAddresses).Count;
          if (uVar5 != 0) {
            pCVar10 = (this->CaseAddresses).Array;
            lVar8 = 0;
            do {
              if (*(int *)((long)&pCVar10->casevalue + lVar8) ==
                  *(int *)&this_00[1].ScriptPosition.FileName.Chars) {
                VMFunctionBuilder::BackpatchToHere
                          (build,*(size_t *)((long)&pCVar10->jumpaddress + lVar8));
                break;
              }
              lVar8 = lVar8 + 0x10;
            } while (uVar5 << 4 != lVar8);
          }
        }
      }
      else {
        FxExpression::EmitStatement(this_00,build);
      }
      ppFVar11 = ppFVar11 + 1;
    } while (ppFVar11 != ppFVar7);
  }
  uVar5 = (ulong)(this->Breaks).Count;
  if (uVar5 != 0) {
    ppFVar1 = (this->Breaks).Array;
    lVar8 = 0;
    do {
      VMFunctionBuilder::BackpatchToHere(build,*(size_t *)(*(long *)((long)ppFVar1 + lVar8) + 0x30))
      ;
      lVar8 = lVar8 + 8;
    } while (uVar5 << 3 != lVar8);
  }
  if (!bVar9) {
    VMFunctionBuilder::BackpatchToHere(build,sVar4);
  }
  TDeletingArray<FxExpression_*,_FxExpression_*>::DeleteAndClear(&this->Content);
  TArray<FxExpression_*,_FxExpression_*>::ShrinkToFit
            (&(this->Content).super_TArray<FxExpression_*,_FxExpression_*>);
  EVar6.RegNum = 0;
  EVar6.RegType = 0x80;
  EVar6.RegCount = '\x01';
  EVar6.Konst = false;
  EVar6.Fixed = false;
  EVar6.Final = false;
  EVar6.Target = false;
  return EVar6;
}

Assistant:

ExpEmit FxSwitchStatement::Emit(VMFunctionBuilder *build)
{
	assert(Condition != nullptr);
	ExpEmit emit = Condition->Emit(build);
	assert(emit.RegType == REGT_INT);
	// todo: 
	// - sort jump table by value.
	// - optimize the switch dispatcher to run in native code instead of executing each single branch instruction on its own.
	// e.g.: build->Emit(OP_SWITCH, emit.RegNum, build->GetConstantInt(CaseAddresses.Size());
	for (auto &ca : CaseAddresses)
	{
		if (ca.casevalue >= 0 && ca.casevalue <= 0xffff)
		{
			build->Emit(OP_TEST, emit.RegNum, (VM_SHALF)ca.casevalue);
		}
		else if (ca.casevalue < 0 && ca.casevalue >= -0xffff)
		{
			build->Emit(OP_TESTN, emit.RegNum, (VM_SHALF)-ca.casevalue);
		}
		else
		{
			build->Emit(OP_EQ_K, 1, emit.RegNum, build->GetConstantInt(ca.casevalue));
		}
		ca.jumpaddress = build->Emit(OP_JMP, 0);
	}
	size_t DefaultAddress = build->Emit(OP_JMP, 0);
	bool defaultset = false;

	for (auto line : Content)
	{
		switch (line->ExprType)
		{
		case EFX_CaseStatement:
			if (static_cast<FxCaseStatement *>(line)->Condition != nullptr)
			{
				for (auto &ca : CaseAddresses)
				{
					if (ca.casevalue == static_cast<FxCaseStatement *>(line)->CaseValue)
					{
						build->BackpatchToHere(ca.jumpaddress);
						break;
					}
				}
			}
			else
			{
				build->BackpatchToHere(DefaultAddress);
				defaultset = true;
			}
			break;

		default:
			line->EmitStatement(build);
			break;
		}
	}
	for (auto addr : Breaks)
	{
		build->BackpatchToHere(addr->Address);
	}
	if (!defaultset) build->BackpatchToHere(DefaultAddress);
	Content.DeleteAndClear();
	Content.ShrinkToFit();
	return ExpEmit();
}